

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

int clip_n_mmproj_embd(clip_ctx *ctx)

{
  pointer pcVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  mapped_type *pmVar4;
  runtime_error *this;
  string proj_type;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  switch(ctx->proj_type) {
  case PROJECTOR_TYPE_MLP:
  case PROJECTOR_TYPE_PIXTRAL:
    pgVar3 = (ctx->vision_model).mm_2_b;
    break;
  case PROJECTOR_TYPE_MLP_NORM:
    pgVar3 = (ctx->vision_model).mm_3_b;
    break;
  case PROJECTOR_TYPE_LDP:
    pgVar3 = (ctx->vision_model).mm_model_block_1_block_2_1_b;
    break;
  case PROJECTOR_TYPE_LDPV2:
    pgVar3 = (ctx->vision_model).mm_model_peg_0_b;
    break;
  case PROJECTOR_TYPE_RESAMPLER:
    uVar2 = ctx->minicpmv_version - 2;
    if (uVar2 < 3) {
      return *(int *)(&DAT_0023c4d0 + (ulong)uVar2 * 4);
    }
  default:
    pmVar4 = std::
             map<projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<projector_type>,_std::allocator<std::pair<const_projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&PROJECTOR_TYPE_NAMES_abi_cxx11_,&ctx->proj_type);
    local_40[0] = local_30;
    pcVar1 = (pmVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + pmVar4->_M_string_length);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_
              (&local_60,"%s: don\'t support projector with: %s currently\n","clip_n_mmproj_embd",
               local_40[0]);
    std::runtime_error::runtime_error(this,(string *)&local_60);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case PROJECTOR_TYPE_GLM_EDGE:
    pgVar3 = (ctx->vision_model).mm_model_mlp_3_w;
    goto LAB_00135552;
  case PROJECTOR_TYPE_MERGER:
    pgVar3 = (ctx->vision_model).mm_1_b;
    break;
  case PROJECTOR_TYPE_GEMMA3:
    pgVar3 = (ctx->vision_model).mm_input_proj_w;
    break;
  case PROJECTOR_TYPE_IDEFICS3:
    pgVar3 = (ctx->vision_model).projection;
LAB_00135552:
    return (int)pgVar3->ne[1];
  }
  return (int)pgVar3->ne[0];
}

Assistant:

int clip_n_mmproj_embd(const struct clip_ctx * ctx) {
    switch (ctx->proj_type) {
        case PROJECTOR_TYPE_LDP:
            return ctx->vision_model.mm_model_block_1_block_2_1_b->ne[0];
        case PROJECTOR_TYPE_LDPV2:
            return ctx->vision_model.mm_model_peg_0_b->ne[0];
        case PROJECTOR_TYPE_MLP:
        case PROJECTOR_TYPE_PIXTRAL:
            return ctx->vision_model.mm_2_b->ne[0];
        case PROJECTOR_TYPE_MLP_NORM:
            return ctx->vision_model.mm_3_b->ne[0];
        case PROJECTOR_TYPE_RESAMPLER:
            if (ctx->minicpmv_version == 2) {
                return 4096;
            } else if (ctx->minicpmv_version == 3) {
                return 3584;
            } else if (ctx->minicpmv_version == 4) {
                return 3584;
            }
            break; // Should not happen if version is valid
        case PROJECTOR_TYPE_GLM_EDGE:
            return ctx->vision_model.mm_model_mlp_3_w->ne[1];
        case PROJECTOR_TYPE_MERGER:
            return ctx->vision_model.mm_1_b->ne[0];
        case PROJECTOR_TYPE_GEMMA3:
            return ctx->vision_model.mm_input_proj_w->ne[0];
        case PROJECTOR_TYPE_IDEFICS3:
            return ctx->vision_model.projection->ne[1];
        default:
            break; // Fall through to throw
    }

    std::string proj_type = PROJECTOR_TYPE_NAMES[ctx->proj_type];
    throw std::runtime_error(string_format("%s: don't support projector with: %s currently\n", __func__, proj_type.c_str()));
}